

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  void *local_58;
  int *local_50;
  size_t local_48;
  int local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  size_t local_20;
  
  (*mb->_vptr_ModelBin[2])(&local_58,mb,(ulong)(uint)this->scale_data_size,1);
  if (&this->scale_data != (Mat *)&local_58) {
    if (local_50 != (int *)0x0) {
      LOCK();
      *local_50 = *local_50 + 1;
      UNLOCK();
    }
    piVar1 = (this->scale_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = (this->scale_data).data;
        pAVar2 = (this->scale_data).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->scale_data).data = local_58;
    (this->scale_data).refcount = local_50;
    (this->scale_data).elemsize = local_48;
    (this->scale_data).elempack = local_40;
    (this->scale_data).allocator = local_38;
    (this->scale_data).dims = local_30;
    (this->scale_data).w = iStack_2c;
    (this->scale_data).h = iStack_28;
    (this->scale_data).c = iStack_24;
    (this->scale_data).cstep = local_20;
  }
  if (local_50 != (int *)0x0) {
    LOCK();
    *local_50 = *local_50 + -1;
    UNLOCK();
    if (*local_50 == 0) {
      if (local_38 == (Allocator *)0x0) {
        if (local_58 != (void *)0x0) {
          free(local_58);
        }
      }
      else {
        (**(code **)(*(long *)local_38 + 0x18))();
      }
    }
  }
  if (((this->scale_data).data == (void *)0x0) ||
     (iVar3 = 0, (long)(this->scale_data).c * (this->scale_data).cstep == 0)) {
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}